

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O2

int run_test_get_currentexe(void)

{
  size_t sVar1;
  int iVar2;
  char *__s1;
  size_t sVar3;
  char *pcVar4;
  undefined8 uStack_420;
  size_t size;
  char buffer [1024];
  
  size = 0x400;
  iVar2 = uv_exepath(buffer,&size);
  if (iVar2 == 0) {
    pcVar4 = executable_path;
    if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
      pcVar4 = executable_path + 2;
    }
    __s1 = strstr(buffer,pcVar4);
    if (__s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,pcVar4);
      sVar1 = size;
      if (iVar2 == 0) {
        sVar3 = strlen(buffer);
        if (sVar1 == sVar3) {
          size = 0x400;
          iVar2 = uv_exepath((char *)0x0,&size);
          if (iVar2 == -0x16) {
            iVar2 = uv_exepath(buffer,(size_t *)0x0);
            if (iVar2 == -0x16) {
              size = 0;
              iVar2 = uv_exepath(buffer,&size);
              if (iVar2 == -0x16) {
                memset(buffer,0xff,0x400);
                size = 1;
                iVar2 = uv_exepath(buffer,&size);
                if (iVar2 == 0) {
                  if (size == 0) {
                    if (buffer[0] == '\0') {
                      memset(buffer,0xff,0x400);
                      size = 2;
                      iVar2 = uv_exepath(buffer,&size);
                      if (iVar2 == 0) {
                        if (size == 1) {
                          if (buffer[0] == '\0') {
                            pcVar4 = "buffer[0] != \'\\0\'";
                            uStack_420 = 0x52;
                          }
                          else {
                            if (buffer[1] == '\0') {
                              return 0;
                            }
                            pcVar4 = "buffer[1] == \'\\0\'";
                            uStack_420 = 0x53;
                          }
                        }
                        else {
                          pcVar4 = "size == 1";
                          uStack_420 = 0x51;
                        }
                      }
                      else {
                        pcVar4 = "r == 0";
                        uStack_420 = 0x50;
                      }
                    }
                    else {
                      pcVar4 = "buffer[0] == \'\\0\'";
                      uStack_420 = 0x4a;
                    }
                  }
                  else {
                    pcVar4 = "size == 0";
                    uStack_420 = 0x49;
                  }
                }
                else {
                  pcVar4 = "r == 0";
                  uStack_420 = 0x48;
                }
              }
              else {
                pcVar4 = "r == UV_EINVAL";
                uStack_420 = 0x42;
              }
            }
            else {
              pcVar4 = "r == UV_EINVAL";
              uStack_420 = 0x3e;
            }
          }
          else {
            pcVar4 = "r == UV_EINVAL";
            uStack_420 = 0x3b;
          }
        }
        else {
          pcVar4 = "size == strlen(buffer)";
          uStack_420 = 0x36;
        }
        goto LAB_0012bec6;
      }
    }
    pcVar4 = "match && !strcmp(match, path)";
    uStack_420 = 0x35;
  }
  else {
    pcVar4 = "!r";
    uStack_420 = 0x26;
  }
LAB_0012bec6:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-get-currentexe.c"
          ,uStack_420,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(get_currentexe) {
  char buffer[PATHMAX];
  size_t size;
  char* match;
  char* path;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

  /* uv_exepath can return an absolute path on darwin, so if the test runner
   * was run with a relative prefix of "./", we need to strip that prefix off
   * executable_path or we'll fail. */
  if (executable_path[0] == '.' && executable_path[1] == '/') {
    path = executable_path + 2;
  } else {
    path = executable_path;
  }

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT(size == strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT(r == UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT(r == UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT(r == UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(buffer[0] == '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 1);
  ASSERT(buffer[0] != '\0');
  ASSERT(buffer[1] == '\0');

  return 0;
}